

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistage_vector_quantization.cc
# Opt level: O2

void __thiscall
sptk::MultistageVectorQuantization::MultistageVectorQuantization
          (MultistageVectorQuantization *this,int num_order,int num_stage)

{
  this->_vptr_MultistageVectorQuantization =
       (_func_int **)&PTR__MultistageVectorQuantization_00111c70;
  this->num_order_ = num_order;
  this->num_stage_ = num_stage;
  VectorQuantization::VectorQuantization(&this->vector_quantization_,num_order);
  this->is_valid_ = true;
  if (((this->num_order_ < 0) || (this->num_stage_ < 1)) ||
     ((this->vector_quantization_).is_valid_ == false)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

MultistageVectorQuantization::MultistageVectorQuantization(int num_order,
                                                           int num_stage)
    : num_order_(num_order),
      num_stage_(num_stage),
      vector_quantization_(num_order_),
      is_valid_(true) {
  if (num_order_ < 0 || num_stage_ <= 0 || !vector_quantization_.IsValid()) {
    is_valid_ = false;
    return;
  }
}